

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::addNode(GraphViewer *this,int id,int x,int y)

{
  Connection *this_00;
  bool bVar1;
  ostream *poVar2;
  string str;
  char buff [200];
  allocator local_139;
  string local_138;
  string local_118 [32];
  char local_f8 [208];
  
  if (this->isDynamic == true) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "This graph is dynamic, so the provided x and y values for the node with id "
                            );
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,id);
    poVar2 = std::operator<<(poVar2," will be ignored");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  sprintf(local_f8,"addNode3 %d %d %d\n",(ulong)(uint)id,(ulong)(uint)x,(ulong)(uint)y);
  std::__cxx11::string::string(local_118,local_f8,&local_139);
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_138,local_118);
  bVar1 = Connection::sendMsg(this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string(local_118);
  return bVar1;
}

Assistant:

bool GraphViewer::addNode(int id, int x, int y) {
	if(isDynamic) {
		cerr << "This graph is dynamic, "
				"so the provided x and y values for the node with id "
				<< id << " will be ignored" << endl;
	}

	char buff[200];
	sprintf(buff, "addNode3 %d %d %d\n", id, x, y);
	string str(buff);
	return con->sendMsg(str);
}